

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  ImGuiContext *pIVar3;
  size_t data_size;
  ImGuiWindowSettings *this;
  ImGuiWindowSettings *this_00;
  char *__dest;
  ImGuiWindowSettings *settings;
  size_t chunk_size;
  size_t name_len;
  char *p;
  ImGuiContext *g;
  char *name_local;
  
  pIVar1 = GImGui;
  pIVar3 = (ImGuiContext *)strstr(name,"###");
  g = (ImGuiContext *)name;
  if (pIVar3 != (ImGuiContext *)0x0) {
    g = pIVar3;
  }
  data_size = strlen(&g->Initialized);
  this = ImChunkStream<ImGuiWindowSettings>::alloc_chunk(&pIVar1->SettingsWindows,data_size + 0x21);
  this_00 = (ImGuiWindowSettings *)operator_new(0x20);
  ImGuiWindowSettings::ImGuiWindowSettings(this_00);
  IVar2 = ImHashStr(&g->Initialized,data_size,0);
  this->ID = IVar2;
  __dest = ImGuiWindowSettings::GetName(this);
  memcpy(__dest,g,data_size + 1);
  return this;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;

#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    const size_t name_len = strlen(name);

    // Allocate chunk
    const size_t chunk_size = sizeof(ImGuiWindowSettings) + name_len + 1;
    ImGuiWindowSettings* settings = g.SettingsWindows.alloc_chunk(chunk_size);
    IM_PLACEMENT_NEW(settings) ImGuiWindowSettings();
    settings->ID = ImHashStr(name, name_len);
    memcpy(settings->GetName(), name, name_len + 1);   // Store with zero terminator

    return settings;
}